

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

Edits * __thiscall icu_63::Edits::moveArray(Edits *this,Edits *src)

{
  UBool UVar1;
  Edits *src_local;
  Edits *this_local;
  
  UVar1 = ::U_FAILURE(this->errorCode_);
  if (UVar1 == '\0') {
    releaseArray(this);
    if (this->length < 0x65) {
      this->array = this->stackArray;
      this->capacity = 100;
      if (0 < this->length) {
        memcpy(this->array,src->array,(long)this->length << 1);
      }
    }
    else {
      this->array = src->array;
      this->capacity = src->capacity;
      src->array = src->stackArray;
      src->capacity = 100;
      reset(src);
    }
  }
  else {
    this->numChanges = 0;
    this->delta = 0;
    this->length = 0;
  }
  return this;
}

Assistant:

Edits &Edits::moveArray(Edits &src) U_NOEXCEPT {
    if (U_FAILURE(errorCode_)) {
        length = delta = numChanges = 0;
        return *this;
    }
    releaseArray();
    if (length > STACK_CAPACITY) {
        array = src.array;
        capacity = src.capacity;
        src.array = src.stackArray;
        src.capacity = STACK_CAPACITY;
        src.reset();
        return *this;
    }
    array = stackArray;
    capacity = STACK_CAPACITY;
    if (length > 0) {
        uprv_memcpy(array, src.array, (size_t)length * 2);
    }
    return *this;
}